

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedAESBlock(string *name,uint bits,string *selected)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  anon_class_16_2_0912d79b local_398;
  function<bool_()> local_388;
  undefined1 local_368 [8];
  TimeResults results_3;
  uint8_t block_1 [16];
  AES_KEY key_1;
  anon_class_8_1_8989d204 local_230;
  function<bool_()> local_228;
  undefined1 local_208 [8];
  TimeResults results_2;
  anon_class_16_2_0912d79b local_1d8;
  function<bool_()> local_1c8;
  undefined1 local_1a8 [8];
  TimeResults results_1;
  uint8_t block [16];
  AES_KEY key;
  anon_class_8_1_8989d204 local_60;
  function<bool_()> local_58;
  undefined1 local_38 [8];
  TimeResults results;
  string *selected_local;
  string *psStack_18;
  uint bits_local;
  string *name_local;
  
  results.us = (uint64_t)selected;
  selected_local._4_4_ = bits;
  psStack_18 = name;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (lVar4 = std::__cxx11::string::find((string *)psStack_18,results.us), lVar4 == -1)) {
    return true;
  }
  local_60.bits = (uint *)((long)&selected_local + 4);
  std::function<bool()>::
  function<SpeedAESBlock(std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&)::__0,void>
            ((function<bool()> *)&local_58,&local_60);
  bVar1 = TimeFunctionParallel((TimeResults *)local_38,&local_58);
  std::function<bool_()>::~function(&local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (key.rd_key + 0x3b),psStack_18," encrypt setup");
    TimeResults::Print((TimeResults *)local_38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (key.rd_key + 0x3b));
    std::__cxx11::string::~string((string *)(key.rd_key + 0x3b));
    iVar2 = AES_set_encrypt_key("",selected_local._4_4_,(AES_KEY *)(block + 0xc));
    if (iVar2 == 0) {
      results_1.us = 0;
      block[0] = '\0';
      block[1] = '\0';
      block[2] = '\0';
      block[3] = '\0';
      block[4] = '\0';
      block[5] = '\0';
      block[6] = '\0';
      block[7] = '\0';
      local_1d8.block = (uint8_t (*) [16])&results_1.us;
      local_1d8.key = (AES_KEY *)(block + 0xc);
      std::function<bool()>::
      function<SpeedAESBlock(std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&)::__1,void>
                ((function<bool()> *)&local_1c8,&local_1d8);
      bVar1 = TimeFunctionParallel((TimeResults *)local_1a8,&local_1c8);
      std::function<bool_()>::~function(&local_1c8);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &results_2.us,psStack_18," encrypt");
        TimeResults::Print((TimeResults *)local_1a8,(string *)&results_2.us);
        std::__cxx11::string::~string((string *)&results_2.us);
        local_230.bits = (uint *)((long)&selected_local + 4);
        std::function<bool()>::
        function<SpeedAESBlock(std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&)::__2,void>
                  ((function<bool()> *)&local_228,&local_230);
        bVar1 = TimeFunctionParallel((TimeResults *)local_208,&local_228);
        std::function<bool_()>::~function(&local_228);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (key_1.rd_key + 0x3b),psStack_18," decrypt setup");
          TimeResults::Print((TimeResults *)local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (key_1.rd_key + 0x3b));
          std::__cxx11::string::~string((string *)(key_1.rd_key + 0x3b));
          iVar2 = AES_set_decrypt_key("",selected_local._4_4_,(AES_KEY *)(block_1 + 0xc));
          if (iVar2 == 0) {
            results_3.us = 0;
            block_1[0] = '\0';
            block_1[1] = '\0';
            block_1[2] = '\0';
            block_1[3] = '\0';
            block_1[4] = '\0';
            block_1[5] = '\0';
            block_1[6] = '\0';
            block_1[7] = '\0';
            local_398.block = (uint8_t (*) [16])&results_3.us;
            local_398.key = (AES_KEY *)(block_1 + 0xc);
            std::function<bool()>::
            function<SpeedAESBlock(std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&)::__3,void>
                      ((function<bool()> *)&local_388,&local_398);
            bVar1 = TimeFunctionParallel((TimeResults *)local_368,&local_388);
            std::function<bool_()>::~function(&local_388);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              std::operator+(&local_3b8,psStack_18," decrypt");
              TimeResults::Print((TimeResults *)local_368,&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
              name_local._7_1_ = true;
            }
            else {
              fprintf(_stderr,"AES_decrypt failed.\n");
              name_local._7_1_ = false;
            }
          }
          else {
            name_local._7_1_ = false;
          }
        }
        else {
          fprintf(_stderr,"AES_set_decrypt_key failed.\n");
          name_local._7_1_ = false;
        }
      }
      else {
        fprintf(_stderr,"AES_encrypt failed.\n");
        name_local._7_1_ = false;
      }
    }
    else {
      name_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"AES_set_encrypt_key failed.\n");
    name_local._7_1_ = false;
  }
  return name_local._7_1_;
}

Assistant:

static bool SpeedAESBlock(const std::string &name, unsigned bits,
                          const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  static const uint8_t kZero[32] = {0};

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_encrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_encrypt_key failed.\n");
      return false;
    }
    results.Print(name + " encrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_encrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_encrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_encrypt failed.\n");
      return false;
    }
    results.Print(name + " encrypt");
  }

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_decrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_decrypt_key failed.\n");
      return false;
    }
    results.Print(name + " decrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_decrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_decrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_decrypt failed.\n");
      return false;
    }
    results.Print(name + " decrypt");
  }

  return true;
}